

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O1

uint64_t dg::llvmutils::getAllocatedSize(AllocaInst *AI,DataLayout *DL)

{
  uint uVar1;
  SmallPtrSetImpl *Ty;
  long lVar2;
  undefined1 auVar4 [16];
  char cVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint64_t uVar8;
  TypeSize TVar9;
  TypeSize local_30;
  undefined1 auVar3 [12];
  
  Ty = *(SmallPtrSetImpl **)(AI + 0x40);
  uVar1 = *(uint *)(Ty + 8);
  if ((byte)uVar1 < 0x12) {
    if ((0xac7fU >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001202f7;
    if ((0x30000U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00120396;
  }
  else {
LAB_00120396:
    if ((uVar1 & 0xfe) != 0x12) {
      return 0;
    }
  }
  cVar5 = llvm::Type::isSizedDerivedType(Ty);
  if (cVar5 == '\0') {
    return 0;
  }
LAB_001202f7:
  cVar5 = llvm::AllocaInst::isArrayAllocation();
  if (cVar5 == '\0') {
    TVar9 = llvm::DataLayout::getTypeAllocSize(DL,(Type *)Ty);
    auVar3 = TVar9.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>._0_12_;
  }
  else {
    lVar2 = *(long *)(AI + -0x20);
    uVar6 = Offset::UNKNOWN;
    if ((lVar2 != 0) && (*(char *)(lVar2 + 0x10) == '\x10')) {
      uVar6 = llvm::APInt::getLimitedValue((APInt *)(lVar2 + 0x18),0xffffffffffffffff);
    }
    uVar8 = 0;
    if (uVar6 != 0xffffffffffffffff) {
      uVar8 = uVar6;
    }
    TVar9 = llvm::DataLayout::getTypeAllocSize(DL,(Type *)Ty);
    auVar4._8_8_ = TVar9.super_LinearPolySize<llvm::TypeSize>.
                   super_UnivariateLinearPolyBase<llvm::TypeSize>._8_8_;
    auVar4._0_8_ = TVar9.super_LinearPolySize<llvm::TypeSize>.
                   super_UnivariateLinearPolyBase<llvm::TypeSize>.Value * uVar8;
    auVar3 = auVar4._0_12_;
  }
  local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.Value
       = auVar3._0_8_;
  local_30.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
  UnivariateDim = auVar3._8_4_;
  uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_30);
  return uVar7;
}

Assistant:

inline uint64_t getAllocatedSize(const llvm::AllocaInst *AI,
                                 const llvm::DataLayout *DL) {
    llvm::Type *Ty = AI->getAllocatedType();
    if (!Ty->isSized())
        return 0;

    if (AI->isArrayAllocation()) {
        return getConstantSizeValue(AI->getArraySize()) *
               DL->getTypeAllocSize(Ty);
    }
    return DL->getTypeAllocSize(Ty);
}